

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Psr_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Psr_Ntk_t *pPVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  int i;
  int iVar9;
  int i_00;
  uint uVar10;
  Vec_Int_t *p;
  Vec_Int_t *local_78 [4];
  Vec_Int_t *vSigs [4];
  
  if (vPrs->nSize < 1) {
    pPVar5 = (Psr_Ntk_t *)0x0;
  }
  else {
    pPVar5 = (Psr_Ntk_t *)Vec_PtrEntry(vPrs,0);
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  pcVar6 = Psr_NtkStr(pPVar5,pPVar5->iModuleName);
  pcVar7 = Extra_TimeStamp();
  fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar6,pcVar7);
  i_00 = 0;
  do {
    if (vPrs->nSize <= i_00) {
      fclose(__stream);
      return;
    }
    pPVar5 = (Psr_Ntk_t *)Vec_PtrEntry(vPrs,i_00);
    pcVar6 = Psr_NtkStr(pPVar5,pPVar5->iModuleName);
    fprintf(__stream,"module %s (\n    ",pcVar6);
    for (iVar9 = 0; iVar9 < (pPVar5->vOrder).nSize; iVar9 = iVar9 + 1) {
      iVar2 = Vec_IntEntry(&pPVar5->vOrder,iVar9);
      pcVar7 = Psr_NtkStr(pPVar5,iVar2);
      pcVar6 = "    \"%s\", ";
      if (iVar9 == (pPVar5->vOrder).nSize + -1) {
        pcVar6 = "T = %d\t\t";
      }
      fprintf(__stream,"%s%s",pcVar7,pcVar6 + 8);
    }
    fwrite("\n  );\n",6,1,__stream);
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      vSigs[0] = &pPVar5->vInouts;
      vSigs[1] = &pPVar5->vInputs;
      vSigs[2] = &pPVar5->vOutputs;
      vSigs[3] = &pPVar5->vWires;
      local_78[0] = &pPVar5->vInoutsR;
      local_78[1] = &pPVar5->vInputsR;
      local_78[2] = &pPVar5->vOutputsR;
      local_78[3] = &pPVar5->vWiresR;
      if (lVar8 == 3) {
        fputc(10,__stream);
      }
      pVVar1 = vSigs[lVar8];
      for (iVar9 = 0; iVar9 < pVVar1->nSize; iVar9 = iVar9 + 1) {
        iVar3 = Vec_IntEntry(pVVar1,iVar9);
        iVar4 = Vec_IntEntry(local_78[lVar8],iVar9);
        iVar2 = *(int *)(&DAT_007cb92c + lVar8 * 4);
        pcVar6 = "";
        if (iVar4 != 0) {
          pcVar6 = Psr_NtkStr(pPVar5,iVar4);
        }
        pcVar7 = Psr_NtkStr(pPVar5,iVar3);
        fprintf(__stream,"  %s %s%s;\n",&DAT_007cb92c + iVar2,pcVar6,pcVar7);
      }
    }
    fputc(10,__stream);
    pVVar1 = &pPVar5->vBoxes;
    p = &pPVar5->vObjs;
    for (iVar9 = 0; iVar9 < (pPVar5->vObjs).nSize; iVar9 = iVar9 + 1) {
      Psr_BoxSignals_V._0_4_ = Psr_BoxSize(pPVar5,iVar9);
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      iVar2 = Vec_IntEntry(p,iVar9);
      Psr_BoxSignals_V._8_8_ = Vec_IntEntryP(pVVar1,iVar2 + 3);
      iVar2 = Vec_IntEntry(p,iVar9);
      iVar2 = Vec_IntEntry(pVVar1,iVar2 + 1);
      if (iVar2 == 0x14) {
        if (Psr_BoxSignals_V._4_4_ != 8) {
          pcVar7 = "Vec_IntSize(vSigs) == 8";
          pcVar6 = "void Psr_ManWriteVerilogMux(FILE *, Psr_Ntk_t *, Vec_Int_t *)";
          uVar10 = 0x60;
LAB_00346e2d:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                        ,uVar10,pcVar6);
        }
        fwrite("  assign ",9,1,__stream);
        iVar2 = Vec_IntEntryLast((Vec_Int_t *)Psr_BoxSignals_V);
        Psr_ManWriteVerilogSignal((FILE *)__stream,pPVar5,iVar2);
        fputs(" = ",__stream);
        lVar8 = 0;
        do {
          if ((long)(int)Psr_BoxSignals_V._4_4_ <= lVar8 + 1) break;
          Vec_IntEntry((Vec_Int_t *)Psr_BoxSignals_V,(int)lVar8);
          iVar2 = Vec_IntEntry((Vec_Int_t *)Psr_BoxSignals_V,(int)lVar8 + 1);
          Psr_ManWriteVerilogSignal((FILE *)__stream,pPVar5,iVar2);
          fputs(&DAT_007cb93c + *(int *)((long)&DAT_007cb940 + lVar8 * 2),__stream);
          lVar8 = lVar8 + 2;
        } while (lVar8 != 6);
      }
      else {
        iVar3 = Vec_IntEntry(p,iVar9);
        iVar3 = Vec_IntEntry(pVVar1,iVar3 + 3);
        if (iVar3 == 0) {
          uVar10 = iVar2 - 6;
          if ((0xf < uVar10) || ((0xbfffU >> (uVar10 & 0x1f) & 1) == 0)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                          ,0x3ab,"char *Ptr_TypeToName(Bac_ObjType_t)");
          }
          fprintf(__stream,"  %s (",&DAT_007cb94c + *(int *)(&DAT_007cb94c + (ulong)uVar10 * 4));
          iVar2 = Vec_IntEntryLast((Vec_Int_t *)Psr_BoxSignals_V);
          Psr_ManWriteVerilogSignal((FILE *)__stream,pPVar5,iVar2);
          iVar2 = Psr_BoxSize(pPVar5,iVar9);
          if (3 < iVar2) {
            fwrite(", ",2,1,__stream);
          }
          Psr_ManWriteVerilogArray
                    ((FILE *)__stream,pPVar5,(Vec_Int_t *)Psr_BoxSignals_V,0,
                     Psr_BoxSignals_V._4_4_ + -2,1);
        }
        else {
          pcVar6 = Psr_NtkStr(pPVar5,iVar2);
          iVar2 = Psr_BoxName(pPVar5,iVar9);
          pcVar7 = "";
          if (iVar2 != 0) {
            iVar2 = Psr_BoxName(pPVar5,iVar9);
            pcVar7 = Psr_NtkStr(pPVar5,iVar2);
          }
          fprintf(__stream,"  %s %s (",pcVar6,pcVar7);
          if ((Psr_BoxSignals_V._4_4_ & 1) != 0) {
            pcVar7 = "Vec_IntSize(vSigs) % 2 == 0";
            pcVar6 = "void Psr_ManWriteVerilogArray2(FILE *, Psr_Ntk_t *, Vec_Int_t *)";
            uVar10 = 0x52;
            goto LAB_00346e2d;
          }
          for (iVar2 = 0; iVar2 + 1 < (int)Psr_BoxSignals_V._4_4_; iVar2 = iVar2 + 2) {
            iVar3 = Vec_IntEntry((Vec_Int_t *)Psr_BoxSignals_V,iVar2);
            iVar4 = Vec_IntEntry((Vec_Int_t *)Psr_BoxSignals_V,iVar2 + 1);
            fputc(0x2e,__stream);
            pcVar6 = Psr_NtkStr(pPVar5,iVar3);
            fputs(pcVar6,__stream);
            fputc(0x28,__stream);
            Psr_ManWriteVerilogSignal((FILE *)__stream,pPVar5,iVar4);
            pcVar6 = "    \"%s\", ";
            if (iVar2 == Psr_BoxSignals_V._4_4_ + -2) {
              pcVar6 = "T = %d\t\t";
            }
            fprintf(__stream,")%s",pcVar6 + 8);
          }
        }
        fwrite(");\n",3,1,__stream);
      }
    }
    fwrite("endmodule\n\n",0xb,1,__stream);
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Psr_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Psr_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_ManWriteVerilogNtk( pFile, pNtk );
    fclose( pFile );
}